

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

void __thiscall
SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Reverse
          (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *this)

{
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar1;
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *ptr;
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *this_00;
  
  ptr = this;
  this_00 = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
            (this->super_SListNodeBase<Memory::Recycler>).next.ptr;
  while (this_00 != this) {
    pSVar1 = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
             (this_00->super_SListNodeBase<Memory::Recycler>).next.ptr;
    Memory::WriteBarrierPtr<SListNodeBase<Memory::Recycler>_>::WriteBarrierSet
              ((WriteBarrierPtr<SListNodeBase<Memory::Recycler>_> *)this_00,
               &ptr->super_SListNodeBase<Memory::Recycler>);
    ptr = this_00;
    this_00 = pSVar1;
  }
  Memory::WriteBarrierPtr<SListNodeBase<Memory::Recycler>_>::WriteBarrierSet
            ((WriteBarrierPtr<SListNodeBase<Memory::Recycler>_> *)this_00,
             &ptr->super_SListNodeBase<Memory::Recycler>);
  return;
}

Assistant:

void Reverse()
    {
        NodeBase * prev = this;
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            current->Next() = prev;
            prev = current;
            current = next;
        }
        current->Next() = prev;
    }